

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_ns.c
# Opt level: O2

int cm_expat_XmlParseXmlDecl
              (int isGeneralTextEntity,ENCODING *enc,char *ptr,char *end,char **badPtr,
              char **versionPtr,char **versionEndPtr,char **encodingName,ENCODING **encoding,
              int *standalone)

{
  int iVar1;
  
  iVar1 = doParseXmlDecl(findEncoding,isGeneralTextEntity,enc,ptr,end,badPtr,versionPtr,
                         versionEndPtr,encodingName,encoding,standalone);
  return iVar1;
}

Assistant:

int NS(XmlParseXmlDecl)(int isGeneralTextEntity,
                        const ENCODING *enc,
                        const char *ptr,
                        const char *end,
                        const char **badPtr,
                        const char **versionPtr,
                        const char **versionEndPtr,
                        const char **encodingName,
                        const ENCODING **encoding,
                        int *standalone)
{
  return doParseXmlDecl(NS(findEncoding),
                        isGeneralTextEntity,
                        enc,
                        ptr,
                        end,
                        badPtr,
                        versionPtr,
                        versionEndPtr,
                        encodingName,
                        encoding,
                        standalone);
}